

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCircuit.hpp
# Opt level: O3

bool __thiscall
qclab::QCircuit<std::complex<double>,_qclab::qgates::QGate1<std::complex<double>_>_>::equals
          (QCircuit<std::complex<double>,_qclab::qgates::QGate1<std::complex<double>_>_> *this,
          QObject<std::complex<double>_> *other)

{
  double *pdVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long local_28;
  void *local_20;
  long local_18;
  void *local_10;
  
  (*other->_vptr_QObject[7])(&local_28);
  (*(this->super_QObject<std::complex<double>_>)._vptr_QObject[7])(&local_18,this);
  if (local_18 == local_28) {
    if (0 < local_18) {
      lVar4 = (long)local_20 + 8;
      lVar3 = (long)local_10 + 8;
      lVar7 = 0;
      bVar5 = false;
      do {
        lVar8 = 0;
        lVar9 = local_18;
        do {
          dVar2 = *(double *)(lVar3 + -8 + lVar8);
          pdVar1 = (double *)(lVar4 + -8 + lVar8);
          bVar6 = false;
          if ((((dVar2 != *pdVar1) || (bVar6 = bVar5, NAN(dVar2) || NAN(*pdVar1))) ||
              (*(double *)(lVar3 + lVar8) != *(double *)(lVar4 + lVar8))) ||
             (NAN(*(double *)(lVar3 + lVar8)) || NAN(*(double *)(lVar4 + lVar8))))
          goto LAB_00163979;
          lVar8 = lVar8 + 0x10;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
        lVar7 = lVar7 + 1;
        lVar4 = lVar4 + local_18 * 0x10;
        lVar3 = lVar3 + local_18 * 0x10;
      } while (lVar7 != local_18);
    }
    bVar6 = true;
  }
  else {
    bVar6 = false;
  }
LAB_00163979:
  if (local_10 != (void *)0x0) {
    operator_delete__(local_10);
  }
  if (local_20 != (void *)0x0) {
    operator_delete__(local_20);
  }
  return bVar6;
}

Assistant:

inline bool equals( const QObject< T >& other ) const override {
        return ( other.matrix() == matrix() ) ;
      }